

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void GUIKeyCallback(HGUI handle,int key,int scancode,int action,int mods)

{
  GLFWwindow *window;
  GUI *gui;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  HGUI handle_local;
  
  if (action == 1) {
    mu_input_keydown(*(mu_Context **)((long)handle + 0x10),
                     (int)*(char *)((long)handle +
                                   (long)(
                                         "030000005e0400008e02000003030000,Be1 GC101 Xbox 360 Controller mode,a:b0,b:b1,back:b6,dpdown:h0.4,dpleft:h0.8,dpright:h0.2,dpup:h0.1,guide:b8,leftshoulder:b4,leftstick:b9,lefttrigger:a2,leftx:a0,lefty:a1,rightshoulder:b5,rightstick:b10,righttrigger:a5,rightx:a3,righty:a4,start:b7,x:b2,y:b3,platform:Linux,"
                                         + (long)key + 0xab)));
  }
  if (action == 0) {
    mu_input_keyup(*(mu_Context **)((long)handle + 0x10),
                   (int)*(char *)((long)handle +
                                 (long)(
                                       "030000005e0400008e02000003030000,Be1 GC101 Xbox 360 Controller mode,a:b0,b:b1,back:b6,dpdown:h0.4,dpleft:h0.8,dpright:h0.2,dpup:h0.1,guide:b8,leftshoulder:b4,leftstick:b9,lefttrigger:a2,leftx:a0,lefty:a1,rightshoulder:b5,rightstick:b10,righttrigger:a5,rightx:a3,righty:a4,start:b7,x:b2,y:b3,platform:Linux,"
                                       + (long)key + 0xab)));
  }
  return;
}

Assistant:

void GUIKeyCallback(HGUI handle, int key, int scancode, int action, int mods) {
    GUI* gui = (GUI*)handle;
    GLFWwindow* window = gui->Window;
    if (action == GLFW_PRESS) {
        mu_input_keydown(gui->Ctx, gui->KeyMap[key]);
    }
    if (action == GLFW_RELEASE) {
        mu_input_keyup(gui->Ctx, gui->KeyMap[key]);
    }
}